

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::addRow(Highs *this,double lower_bound,double upper_bound,HighsInt num_new_nz,
             HighsInt *indices,double *values)

{
  HighsStatus HVar1;
  HighsInt starts;
  double upper_bound_local;
  double lower_bound_local;
  
  upper_bound_local = upper_bound;
  lower_bound_local = lower_bound;
  logHeader(this);
  starts = 0;
  HVar1 = addRows(this,1,&lower_bound_local,&upper_bound_local,num_new_nz,&starts,indices,values);
  return HVar1;
}

Assistant:

HighsStatus Highs::addRow(const double lower_bound, const double upper_bound,
                          const HighsInt num_new_nz, const HighsInt* indices,
                          const double* values) {
  this->logHeader();
  HighsInt starts = 0;
  return addRows(1, &lower_bound, &upper_bound, num_new_nz, &starts, indices,
                 values);
}